

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void clip_build_img_from_pixels(uchar *rgb_pixels,int nx,int ny,clip_image_u8 *img)

{
  pointer __dest;
  
  img->nx = nx;
  img->ny = ny;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&img->buf,(long)(nx * ny * 3));
  __dest = (img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(__dest,rgb_pixels,
         (long)(img->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)__dest);
  return;
}

Assistant:

void clip_build_img_from_pixels(const unsigned char * rgb_pixels, int nx, int ny, clip_image_u8 * img) {
    img->nx = nx;
    img->ny = ny;
    img->buf.resize(3 * nx * ny);
    memcpy(img->buf.data(), rgb_pixels, img->buf.size());
}